

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void prvTidyParseBlock(TidyDocImpl *doc,Node *element,GetTokenMode mode)

{
  Node **ppNVar1;
  TidyTagId TVar2;
  Lexer *pLVar3;
  Node *pNVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  Bool BVar8;
  int iVar9;
  uint uVar10;
  Node *pNVar11;
  tmbstr ptVar12;
  Dict *pDVar13;
  uint uVar14;
  GetTokenMode GVar15;
  Node **ppNVar16;
  GetTokenMode mode_00;
  
  uVar10 = element->tag->model;
  if ((uVar10 & 1) != 0) {
    return;
  }
  pLVar3 = doc->lexer;
  if ((element->tag->id == TidyTag_FORM) &&
     (BVar8 = DescendantOf(element,TidyTag_FORM), BVar8 != no)) {
    prvTidyReportError(doc,element,(Node *)0x0,0xe1);
    uVar10 = element->tag->model;
  }
  uVar14 = 0;
  if ((uVar10 >> 0xb & 1) != 0) {
    uVar14 = pLVar3->istackbase;
    pLVar3->istackbase = pLVar3->istacksize;
  }
  if ((uVar10 >> 0x11 & 1) == 0) {
    prvTidyInlineDup(doc,(Node *)0x0);
    uVar10 = element->tag->model;
  }
  mode_00 = mode + (mode == IgnoreWhitespace);
  if ((uVar10 & 0x410) != 0x10) {
    mode_00 = IgnoreWhitespace;
  }
  ppNVar1 = &element->content;
  bVar5 = true;
LAB_00125ff7:
  pNVar11 = prvTidyGetToken(doc,mode_00);
  if (pNVar11 != (Node *)0x0) {
    pDVar13 = pNVar11->tag;
    if (pNVar11->type == EndTag) {
      if (pDVar13 != (Dict *)0x0) {
        if ((pDVar13 == element->tag) || (element->was == pDVar13)) {
          prvTidyFreeNode(doc,pNVar11);
          if ((element->tag->model & 0x800) != 0) {
            while (pLVar3->istackbase < pLVar3->istacksize) {
              prvTidyPopInline(doc,(Node *)0x0);
            }
            pLVar3->istackbase = uVar14;
          }
          element->closed = yes;
          goto LAB_00126801;
        }
        goto LAB_0012603d;
      }
      goto LAB_0012606d;
    }
    if (pDVar13 == (Dict *)0x0) goto LAB_001260fa;
LAB_0012603d:
    TVar2 = pDVar13->id;
    if ((TVar2 == TidyTag_HTML) || (TVar2 == TidyTag_HEAD)) {
LAB_00126061:
      BVar8 = prvTidynodeIsElement(pNVar11);
      if (BVar8 != no) goto LAB_0012606d;
      goto LAB_00126080;
    }
    if (TVar2 == TidyTag_BODY) {
      BVar8 = DescendantOf(element,TidyTag_HEAD);
      if (BVar8 == no) goto LAB_00126061;
LAB_00126717:
      prvTidyUngetToken(doc);
      goto LAB_0012671f;
    }
    if (pNVar11->type == EndTag) {
      if (TVar2 == TidyTag_P) {
        pNVar11->type = StartEndTag;
        pNVar11->implicit = yes;
        goto LAB_001260fa;
      }
      if (TVar2 == TidyTag_BR) {
        pNVar11->type = StartTag;
        goto LAB_001260fa;
      }
      BVar8 = DescendantOf(element,TVar2);
      if (BVar8 != no) goto LAB_00126717;
      if ((pLVar3->exiled == no) ||
         ((BVar8 = prvTidynodeHasCM(pNVar11,0x80), BVar8 == no &&
          ((pNVar11->tag == (Dict *)0x0 || (pNVar11->tag->id != TidyTag_TABLE))))))
      goto LAB_001260fa;
      goto LAB_00126771;
    }
LAB_001260fa:
    BVar8 = prvTidynodeIsText(pNVar11);
    if (BVar8 == no) goto LAB_00126199;
    if ((bVar5) && ((element->tag->model & 0x20000) == 0)) {
      iVar9 = prvTidyInlineDup(doc,pNVar11);
      bVar5 = false;
      if (0 < iVar9) goto LAB_00125ff7;
    }
    pNVar11->parent = element;
    pNVar4 = element->last;
    pNVar11->prev = pNVar4;
    ppNVar16 = &pNVar4->next;
    if (pNVar4 == (Node *)0x0) {
      ppNVar16 = ppNVar1;
    }
    *ppNVar16 = pNVar11;
    element->last = pNVar11;
    mode_00 = MixedContent;
    bVar5 = false;
    if (((element->tag != (Dict *)0x0) &&
        (uVar10 = element->tag->id - TidyTag_BLOCKQUOTE, mode_00 = MixedContent, uVar10 < 0x3d)) &&
       (bVar5 = false, (0x1002000000400003U >> ((ulong)uVar10 & 0x3f) & 1) != 0)) {
      prvTidyConstrainVersion(doc,0xfffffedb);
      mode_00 = MixedContent;
    }
    goto LAB_00125ff7;
  }
LAB_0012671f:
  uVar10 = element->tag->model;
  if (-1 < (short)uVar10) {
    prvTidyReportError(doc,element,pNVar11,0xce);
    uVar10 = element->tag->model;
  }
  if ((uVar10 >> 0xb & 1) == 0) goto LAB_00126801;
  while (pLVar3->istackbase < pLVar3->istacksize) {
    prvTidyPopInline(doc,(Node *)0x0);
  }
LAB_001267f5:
  pLVar3->istackbase = uVar14;
LAB_00126801:
  TrimSpaces(doc,element);
  return;
LAB_00126199:
  BVar8 = InsertMisc(element,pNVar11);
  if (BVar8 != no) goto LAB_00125ff7;
  if (pNVar11->tag == (Dict *)0x0) goto LAB_0012606d;
  TVar2 = pNVar11->tag->id;
  if (TVar2 == TidyTag_AREA) {
    if ((element->tag == (Dict *)0x0) || (element->tag->id != TidyTag_MAP)) goto LAB_0012606d;
  }
  else {
    if (TVar2 != TidyTag_PARAM) {
      BVar8 = prvTidynodeHasCM(pNVar11,0x10);
      if (BVar8 == no) {
        BVar8 = prvTidynodeIsElement(pNVar11);
        if (BVar8 == no) {
          if ((pNVar11->tag != (Dict *)0x0) && (pNVar11->tag->id == TidyTag_FORM)) {
            *(byte *)&doc->badForm = (byte)doc->badForm | 1;
          }
          goto LAB_0012606d;
        }
        if (element->tag == (Dict *)0x0) {
LAB_0012632c:
          BVar8 = prvTidynodeHasCM(pNVar11,8);
          if (BVar8 != no) {
            if (pLVar3->excludeBlocks != no) {
              BVar8 = prvTidynodeHasCM(element,0x8000);
              if (BVar8 == no) {
                prvTidyReportError(doc,element,pNVar11,0xcf);
              }
              prvTidyUngetToken(doc);
              BVar8 = prvTidynodeHasCM(element,0x800);
              if (BVar8 != no) goto LAB_001267f5;
              goto LAB_00126801;
            }
            goto LAB_00126239;
          }
          if ((pNVar11->tag->model & 4) != 0) {
LAB_00126596:
            MoveToHead(doc,element,pNVar11);
            goto LAB_00125ff7;
          }
          if ((((element->tag != (Dict *)0x0) && (element->tag->id == TidyTag_FORM)) &&
              ((pNVar4 = element->parent, pNVar4 != (Node *)0x0 &&
               ((pNVar4->tag != (Dict *)0x0 && (pNVar4->tag->id == TidyTag_TD)))))) &&
             (pNVar4->implicit != no)) {
            TVar2 = pNVar11->tag->id;
            if (TVar2 == TidyTag_TH) {
              prvTidyReportError(doc,element,pNVar11,0xd0);
              prvTidyFreeNode(doc,pNVar11);
              pNVar11 = element->parent;
              (*doc->allocator->vtbl->free)(doc->allocator,pNVar11->element);
              ptVar12 = prvTidytmbstrdup(doc->allocator,"th");
              pNVar11->element = ptVar12;
              pDVar13 = prvTidyLookupTagDef(TidyTag_TH);
              pNVar11->tag = pDVar13;
              goto LAB_00125ff7;
            }
            if (TVar2 == TidyTag_TD) goto LAB_0012606d;
          }
          BVar8 = prvTidynodeHasCM(element,0x8000);
          if ((BVar8 == no) && (element->implicit == no)) {
            prvTidyReportError(doc,element,pNVar11,0xcf);
          }
          prvTidyUngetToken(doc);
          BVar8 = prvTidynodeHasCM(pNVar11,0x20);
          if (BVar8 == no) {
            BVar8 = prvTidynodeHasCM(pNVar11,0x40);
            if (BVar8 == no) {
              BVar8 = prvTidynodeHasCM(pNVar11,0x80);
              if ((BVar8 == no) && (BVar8 = prvTidynodeHasCM(pNVar11,0x200), BVar8 == no)) {
                BVar8 = prvTidynodeHasCM(element,0x800);
                if (BVar8 != no) goto LAB_00126834;
                goto LAB_00126801;
              }
              if (pLVar3->exiled != no) {
                return;
              }
              TVar2 = TidyTag_TABLE;
            }
            else {
              if (((element->parent != (Node *)0x0) &&
                  (pDVar13 = element->parent->tag, pDVar13 != (Dict *)0x0)) &&
                 (pDVar13->id == TidyTag_DL)) goto LAB_00126801;
              TVar2 = TidyTag_DL;
            }
            pNVar11 = prvTidyInferredTag(doc,TVar2);
          }
          else {
            if (((element->parent != (Node *)0x0) &&
                (pDVar13 = element->parent->tag, pDVar13 != (Dict *)0x0)) &&
               (pDVar13->parser == prvTidyParseList)) goto LAB_00126801;
            pNVar11 = prvTidyInferredTag(doc,TidyTag_UL);
            AddClassNoIndent(doc,pNVar11);
          }
        }
        else {
          TVar2 = element->tag->id;
          if ((TVar2 != TidyTag_TH) && (TVar2 != TidyTag_TD)) {
            if ((TVar2 == TidyTag_LI) &&
               (((pNVar11->tag != (Dict *)0x0 &&
                 (uVar10 = pNVar11->tag->id - TidyTag_FRAME, uVar10 < 0x2a)) &&
                ((0x30000000003U >> ((ulong)uVar10 & 0x3f) & 1) != 0)))) goto LAB_0012606d;
            goto LAB_0012632c;
          }
          BVar8 = prvTidynodeHasCM(pNVar11,4);
          if (BVar8 != no) goto LAB_00126596;
          BVar8 = prvTidynodeHasCM(pNVar11,0x20);
          if (BVar8 == no) {
            BVar8 = prvTidynodeHasCM(pNVar11,0x40);
            if (BVar8 != no) {
              prvTidyUngetToken(doc);
              pNVar11 = prvTidyInferredTag(doc,TidyTag_DL);
              goto LAB_001265ce;
            }
          }
          else {
            prvTidyUngetToken(doc);
            pNVar11 = prvTidyInferredTag(doc,TidyTag_UL);
            AddClassNoIndent(doc,pNVar11);
LAB_001265ce:
            pLVar3->excludeBlocks = yes;
          }
          BVar8 = prvTidynodeHasCM(pNVar11,8);
          if (BVar8 == no) {
LAB_00126771:
            prvTidyUngetToken(doc);
            goto LAB_00126801;
          }
        }
        if (pNVar11 != (Node *)0x0) goto LAB_00126239;
        bVar6 = true;
        pNVar11 = (Node *)0x0;
      }
      else {
LAB_00126239:
        if (((pNVar11->tag != (Dict *)0x0) && (pNVar11->tag->id == TidyTag_A)) &&
           ((pNVar11->implicit == no &&
            (((pDVar13 = element->tag, pDVar13 != (Dict *)0x0 && (pDVar13->id == TidyTag_A)) ||
             (BVar8 = DescendantOf(element,TidyTag_A), BVar8 != no)))))) {
          if (((pNVar11->type == EndTag) || (pNVar11->attributes != (AttVal *)0x0)) ||
             (*(int *)((doc->config).value + 0x15) == 0)) {
            if ((pDVar13 != (Dict *)0x0) && (pDVar13->id == TidyTag_A)) {
              prvTidyUngetToken(doc);
            }
            prvTidyReportError(doc,element,pNVar11,0xcf);
            if ((mode_00 & Preformatted) != IgnoreWhitespace) {
              return;
            }
            goto LAB_00126801;
          }
          pNVar11->type = EndTag;
          prvTidyReportError(doc,element,pNVar11,0xe0);
          prvTidyUngetToken(doc);
          goto LAB_00125ff7;
        }
        bVar6 = false;
      }
      BVar8 = prvTidynodeIsElement(pNVar11);
      if (BVar8 != no) {
        GVar15 = IgnoreWhitespace;
        bVar7 = true;
        if ((pNVar11->tag->model & 0x10) != 0) {
          if (bVar5) {
            GVar15 = MixedContent;
            bVar7 = true;
            if (pNVar11->implicit == no) {
              GVar15 = MixedContent;
              bVar7 = false;
              if ((element->tag->model & 0x20000) == 0) {
                iVar9 = prvTidyInlineDup(doc,pNVar11);
                bVar5 = false;
                GVar15 = MixedContent;
                bVar7 = false;
                if (0 < iVar9) goto LAB_00125ff7;
              }
            }
          }
          else {
            GVar15 = MixedContent;
            bVar7 = false;
          }
        }
        bVar5 = bVar7;
        if (((!bVar6) && (pNVar11->tag != (Dict *)0x0)) && (pNVar11->tag->id == TidyTag_BR)) {
          TrimSpaces(doc,element);
        }
        pNVar11->parent = element;
        pNVar4 = element->last;
        pNVar11->prev = pNVar4;
        ppNVar16 = &pNVar4->next;
        if (pNVar4 == (Node *)0x0) {
          ppNVar16 = ppNVar1;
        }
        *ppNVar16 = pNVar11;
        element->last = pNVar11;
        if (pNVar11->implicit != no) {
          prvTidyReportError(doc,element,pNVar11,0xd7);
        }
        ParseTag(doc,pNVar11,IgnoreWhitespace);
        mode_00 = GVar15;
        goto LAB_00125ff7;
      }
      if (pNVar11->type == EndTag) {
        prvTidyPopInline(doc,pNVar11);
      }
      goto LAB_0012606d;
    }
    BVar8 = prvTidynodeHasCM(element,0x1000);
    if (BVar8 == no) goto LAB_0012606d;
  }
  BVar8 = prvTidynodeIsElement(pNVar11);
  if (BVar8 != no) {
    pNVar11->parent = element;
    pNVar4 = element->last;
    pNVar11->prev = pNVar4;
    ppNVar16 = &pNVar4->next;
    if (pNVar4 == (Node *)0x0) {
      ppNVar16 = ppNVar1;
    }
    *ppNVar16 = pNVar11;
    element->last = pNVar11;
    goto LAB_00125ff7;
  }
LAB_0012606d:
  prvTidyReportError(doc,element,pNVar11,0xd0);
LAB_00126080:
  prvTidyFreeNode(doc,pNVar11);
  goto LAB_00125ff7;
LAB_00126834:
  while (pLVar3->istackbase < pLVar3->istacksize) {
    prvTidyPopInline(doc,(Node *)0x0);
  }
  goto LAB_001267f5;
}

Assistant:

void TY_(ParseBlock)( TidyDocImpl* doc, Node *element, GetTokenMode mode)
{
#if !defined(NDEBUG) && defined(_MSC_VER)
    static int in_parse_block = 0;
    static int parse_block_cnt = 0;
#endif
    Lexer* lexer = doc->lexer;
    Node *node;
    Bool checkstack = yes;
    uint istackbase = 0;
#if !defined(NDEBUG) && defined(_MSC_VER)
    in_parse_block++;
    parse_block_cnt++;
    SPRTF("Entering ParseBlock %d... %d\n",in_parse_block,parse_block_cnt);
#endif

    if ( element->tag->model & CM_EMPTY ) {
#if !defined(NDEBUG) && defined(_MSC_VER)
        in_parse_block--;
        SPRTF("Exit ParseBlockL 1 %d...\n",in_parse_block);
#endif
        return;
    }

    if ( nodeIsFORM(element) && 
         DescendantOf(element, TidyTag_FORM) )
        TY_(ReportError)(doc, element, NULL, ILLEGAL_NESTING );

    /*
     InlineDup() asks the lexer to insert inline emphasis tags
     currently pushed on the istack, but take care to avoid
     propagating inline emphasis inside OBJECT or APPLET.
     For these elements a fresh inline stack context is created
     and disposed of upon reaching the end of the element.
     They thus behave like table cells in this respect.
    */
    if (element->tag->model & CM_OBJECT)
    {
        istackbase = lexer->istackbase;
        lexer->istackbase = lexer->istacksize;
    }

    if (!(element->tag->model & CM_MIXED))
        TY_(InlineDup)( doc, NULL );

    /*\
     *  Issue #212 - If it is likely that it may be necessary
     *  to move a leading space into a text node before this
     *  element, then keep the mode MixedContent to keep any
     *  leading space
    \*/
    if ( !(element->tag->model & CM_INLINE) ||
          (element->tag->model & CM_FIELD ) )
    {
        mode = IgnoreWhitespace;
    }
    else if (mode == IgnoreWhitespace)
    {
        /* Issue #212 - Further fix in case ParseBlock() is called with 'IgnoreWhitespace'
           when such a leading space may need to be inserted before this element to 
           preverve the browser view */
        mode = MixedContent;
    }

    while ((node = TY_(GetToken)(doc, mode /*MixedContent*/)) != NULL)
    {
        /* end tag for this element */
        if (node->type == EndTag && node->tag &&
            (node->tag == element->tag || element->was == node->tag))
        {
            TY_(FreeNode)( doc, node );

            if (element->tag->model & CM_OBJECT)
            {
                /* pop inline stack */
                while (lexer->istacksize > lexer->istackbase)
                    TY_(PopInline)( doc, NULL );
                lexer->istackbase = istackbase;
            }

            element->closed = yes;
            TrimSpaces( doc, element );
#if !defined(NDEBUG) && defined(_MSC_VER)
            in_parse_block--;
            SPRTF("Exit ParseBlock 2 %d...\n",in_parse_block);
#endif
            return;
        }

        if ( nodeIsBODY( node ) && DescendantOf( element, TidyTag_HEAD ))
        {
            /*  If we're in the HEAD, close it before proceeding.
                This is an extremely rare occurance, but has been observed.
            */
            TY_(UngetToken)( doc );
            break;
        }

        if ( nodeIsHTML(node) || nodeIsHEAD(node) || nodeIsBODY(node) )
        {
            if ( TY_(nodeIsElement)(node) )
                TY_(ReportError)(doc, element, node, DISCARDING_UNEXPECTED );
            TY_(FreeNode)( doc, node );
            continue;
        }


        if (node->type == EndTag)
        {
            if (node->tag == NULL)
            {
                TY_(ReportError)(doc, element, node, DISCARDING_UNEXPECTED );
                TY_(FreeNode)( doc, node );
                continue;
            }
            else if ( nodeIsBR(node) )
                node->type = StartTag;
            else if ( nodeIsP(node) )
            {
                /* Cannot have a block inside a paragraph, so no checking
                   for an ancestor is necessary -- but we _can_ have
                   paragraphs inside a block, so change it to an implicit
                   empty paragraph, to be dealt with according to the user's
                   options
                */
                node->type = StartEndTag;
                node->implicit = yes;
#if OBSOLETE
                TY_(CoerceNode)(doc, node, TidyTag_BR, no, no);
                TY_(FreeAttrs)( doc, node ); /* discard align attribute etc. */
                TY_(InsertNodeAtEnd)( element, node );
                node = InferredTag(doc, TidyTag_BR);
#endif
            }
            else if (DescendantOf( element, node->tag->id ))
            {
                /* 
                  if this is the end tag for an ancestor element
                  then infer end tag for this element
                */
                TY_(UngetToken)( doc );
                break;
#if OBSOLETE
                Node *parent;
                for ( parent = element->parent;
                      parent != NULL; 
                      parent = parent->parent )
                {
                    if (node->tag == parent->tag)
                    {
                        if (!(element->tag->model & CM_OPT))
                            TY_(ReportError)(doc, element, node, MISSING_ENDTAG_BEFORE );

                        TY_(UngetToken)( doc );

                        if (element->tag->model & CM_OBJECT)
                        {
                            /* pop inline stack */
                            while (lexer->istacksize > lexer->istackbase)
                                TY_(PopInline)( doc, NULL );
                            lexer->istackbase = istackbase;
                        }

                        TrimSpaces( doc, element );
                        return;
                    }
                }
#endif
            }
            else
            {
                /* special case </tr> etc. for stuff moved in front of table */
                if ( lexer->exiled
                     && (TY_(nodeHasCM)(node, CM_TABLE) || nodeIsTABLE(node)) )
                {
                    TY_(UngetToken)( doc );
                    TrimSpaces( doc, element );
#if !defined(NDEBUG) && defined(_MSC_VER)
                    in_parse_block--;
                    SPRTF("Exit ParseBlock 2 %d...\n",in_parse_block);
#endif
                    return;
                }
            }
        }

        /* mixed content model permits text */
        if (TY_(nodeIsText)(node))
        {
            if ( checkstack )
            {
                checkstack = no;
                if (!(element->tag->model & CM_MIXED))
                {
                    if ( TY_(InlineDup)(doc, node) > 0 )
                        continue;
                }
            }

            TY_(InsertNodeAtEnd)(element, node);
            mode = MixedContent;

            /*
              HTML4 strict doesn't allow mixed content for
              elements with %block; as their content model
            */
            /*
              But only body, map, blockquote, form and
              noscript have content model %block;
            */
            if ( nodeIsBODY(element)       ||
                 nodeIsMAP(element)        ||
                 nodeIsBLOCKQUOTE(element) ||
                 nodeIsFORM(element)       ||
                 nodeIsNOSCRIPT(element) )
                TY_(ConstrainVersion)( doc, ~VERS_HTML40_STRICT );
            continue;
        }

        if ( InsertMisc(element, node) )
            continue;

        /* allow PARAM elements? */
        if ( nodeIsPARAM(node) )
        {
            if ( TY_(nodeHasCM)(element, CM_PARAM) && TY_(nodeIsElement)(node) )
            {
                TY_(InsertNodeAtEnd)(element, node);
                continue;
            }

            /* otherwise discard it */
            TY_(ReportError)(doc, element, node, DISCARDING_UNEXPECTED );
            TY_(FreeNode)( doc, node );
            continue;
        }

        /* allow AREA elements? */
        if ( nodeIsAREA(node) )
        {
            if ( nodeIsMAP(element) && TY_(nodeIsElement)(node) )
            {
                TY_(InsertNodeAtEnd)(element, node);
                continue;
            }

            /* otherwise discard it */
            TY_(ReportError)(doc, element, node, DISCARDING_UNEXPECTED );
            TY_(FreeNode)( doc, node );
            continue;
        }

        /* ignore unknown start/end tags */
        if ( node->tag == NULL )
        {
            TY_(ReportError)(doc, element, node, DISCARDING_UNEXPECTED );
            TY_(FreeNode)( doc, node );
            continue;
        }

        /*
          Allow CM_INLINE elements here.

          Allow CM_BLOCK elements here unless
          lexer->excludeBlocks is yes.

          LI and DD are special cased.

          Otherwise infer end tag for this element.
        */

        if ( !TY_(nodeHasCM)(node, CM_INLINE) )
        {
            if ( !TY_(nodeIsElement)(node) )
            {
                if ( nodeIsFORM(node) )
                    BadForm( doc );

                TY_(ReportError)(doc, element, node, DISCARDING_UNEXPECTED );
                TY_(FreeNode)( doc, node );
                continue;
            }

            /* #427671 - Fix by Randy Waki - 10 Aug 00 */
            /*
             If an LI contains an illegal FRAME, FRAMESET, OPTGROUP, or OPTION
             start tag, discard the start tag and let the subsequent content get
             parsed as content of the enclosing LI.  This seems to mimic IE and
             Netscape, and avoids an infinite loop: without this check,
             ParseBlock (which is parsing the LI's content) and ParseList (which
             is parsing the LI's parent's content) repeatedly defer to each
             other to parse the illegal start tag, each time inferring a missing
             </li> or <li> respectively.

             NOTE: This check is a bit fragile.  It specifically checks for the
             four tags that happen to weave their way through the current series
             of tests performed by ParseBlock and ParseList to trigger the
             infinite loop.
            */
            if ( nodeIsLI(element) )
            {
                if ( nodeIsFRAME(node)    ||
                     nodeIsFRAMESET(node) ||
                     nodeIsOPTGROUP(node) ||
                     nodeIsOPTION(node) )
                {
                    TY_(ReportError)(doc, element, node, DISCARDING_UNEXPECTED );
                    TY_(FreeNode)( doc, node );  /* DSR - 27Apr02 avoid memory leak */
                    continue;
                }
            }

            if ( nodeIsTD(element) || nodeIsTH(element) )
            {
                /* if parent is a table cell, avoid inferring the end of the cell */

                if ( TY_(nodeHasCM)(node, CM_HEAD) )
                {
                    MoveToHead( doc, element, node );
                    continue;
                }

                if ( TY_(nodeHasCM)(node, CM_LIST) )
                {
                    TY_(UngetToken)( doc );
                    node = TY_(InferredTag)(doc, TidyTag_UL);
                    AddClassNoIndent(doc, node);
                    lexer->excludeBlocks = yes;
                }
                else if ( TY_(nodeHasCM)(node, CM_DEFLIST) )
                {
                    TY_(UngetToken)( doc );
                    node = TY_(InferredTag)(doc, TidyTag_DL);
                    lexer->excludeBlocks = yes;
                }

                /* infer end of current table cell */
                if ( !TY_(nodeHasCM)(node, CM_BLOCK) )
                {
                    TY_(UngetToken)( doc );
                    TrimSpaces( doc, element );
#if !defined(NDEBUG) && defined(_MSC_VER)
                    in_parse_block--;
                    SPRTF("Exit ParseBlock 3 %d...\n",in_parse_block);
#endif
                    return;
                }
            }
            else if ( TY_(nodeHasCM)(node, CM_BLOCK) )
            {
                if ( lexer->excludeBlocks )
                {
                    if ( !TY_(nodeHasCM)(element, CM_OPT) )
                        TY_(ReportError)(doc, element, node, MISSING_ENDTAG_BEFORE );

                    TY_(UngetToken)( doc );

                    if ( TY_(nodeHasCM)(element, CM_OBJECT) )
                        lexer->istackbase = istackbase;

                    TrimSpaces( doc, element );
#if !defined(NDEBUG) && defined(_MSC_VER)
                    in_parse_block--;
                    SPRTF("Exit ParseBlock 4 %d...\n",in_parse_block);
#endif
                    return;
                }
            }
            else /* things like list items */
            {
                if (node->tag->model & CM_HEAD)
                {
                    MoveToHead( doc, element, node );
                    continue;
                }

                /*
                 special case where a form start tag
                 occurs in a tr and is followed by td or th
                */

                if ( nodeIsFORM(element) &&
                     nodeIsTD(element->parent) &&
                     element->parent->implicit )
                {
                    if ( nodeIsTD(node) )
                    {
                        TY_(ReportError)(doc, element, node, DISCARDING_UNEXPECTED );
                        TY_(FreeNode)( doc, node );
                        continue;
                    }

                    if ( nodeIsTH(node) )
                    {
                        TY_(ReportError)(doc, element, node, DISCARDING_UNEXPECTED );
                        TY_(FreeNode)( doc, node );
                        node = element->parent;
                        TidyDocFree(doc, node->element);
                        node->element = TY_(tmbstrdup)(doc->allocator, "th");
                        node->tag = TY_(LookupTagDef)( TidyTag_TH );
                        continue;
                    }
                }

                if ( !TY_(nodeHasCM)(element, CM_OPT) && !element->implicit )
                    TY_(ReportError)(doc, element, node, MISSING_ENDTAG_BEFORE );

                TY_(UngetToken)( doc );

                if ( TY_(nodeHasCM)(node, CM_LIST) )
                {
                    if ( element->parent && element->parent->tag &&
                         element->parent->tag->parser == TY_(ParseList) )
                    {
                        TrimSpaces( doc, element );
#if !defined(NDEBUG) && defined(_MSC_VER)
                        in_parse_block--;
                        SPRTF("Exit ParseBlock 5 %d...\n",in_parse_block);
#endif
                        return;
                    }

                    node = TY_(InferredTag)(doc, TidyTag_UL);
                    AddClassNoIndent(doc, node);
                }
                else if ( TY_(nodeHasCM)(node, CM_DEFLIST) )
                {
                    if ( nodeIsDL(element->parent) )
                    {
                        TrimSpaces( doc, element );
#if !defined(NDEBUG) && defined(_MSC_VER)
                        in_parse_block--;
                        SPRTF("Exit ParseBlock 6 %d...\n",in_parse_block);
#endif
                        return;
                    }

                    node = TY_(InferredTag)(doc, TidyTag_DL);
                }
                else if ( TY_(nodeHasCM)(node, CM_TABLE) || TY_(nodeHasCM)(node, CM_ROW) )
                {
                    /* http://tidy.sf.net/issue/1316307 */
                    /* In exiled mode, return so table processing can 
                       continue. */
                    if (lexer->exiled) {
#if !defined(NDEBUG) && defined(_MSC_VER)
                        in_parse_block--;
                        SPRTF("Exit ParseBlock 7 %d...\n",in_parse_block);
#endif
                        return;
                    }
                    node = TY_(InferredTag)(doc, TidyTag_TABLE);
                }
                else if ( TY_(nodeHasCM)(element, CM_OBJECT) )
                {
                    /* pop inline stack */
                    while ( lexer->istacksize > lexer->istackbase )
                        TY_(PopInline)( doc, NULL );
                    lexer->istackbase = istackbase;
                    TrimSpaces( doc, element );
#if !defined(NDEBUG) && defined(_MSC_VER)
                    in_parse_block--;
                    SPRTF("Exit ParseBlock 8 %d...\n",in_parse_block);
#endif
                    return;

                }
                else
                {
                    TrimSpaces( doc, element );
#if !defined(NDEBUG) && defined(_MSC_VER)
                    in_parse_block--;
                    SPRTF("Exit ParseBlock 9 %d...\n",in_parse_block);
#endif
                    return;
                }
            }
        }

        /*\
         *  Issue #307 - an <A> tag to ends any open <A> element
         *  Like #427827 - fixed by Randy Waki and Bjoern Hoehrmann 23 Aug 00
         *  in ParseInline(), fix copied HERE to ParseBlock()
         *  href: http://www.w3.org/TR/html-markup/a.html
         *  The interactive element a must not appear as a descendant of the a element.
        \*/
        if ( nodeIsA(node) && !node->implicit && 
             (nodeIsA(element) || DescendantOf(element, TidyTag_A)) )
        {
            if (node->type != EndTag && node->attributes == NULL
                && cfgBool(doc, TidyCoerceEndTags) )
            {
                node->type = EndTag;
                TY_(ReportError)(doc, element, node, COERCE_TO_ENDTAG);
                TY_(UngetToken)( doc );
                continue;
            }

            if (nodeIsA(element))
            {
                TY_(UngetToken)( doc );
            }
            TY_(ReportError)(doc, element, node, MISSING_ENDTAG_BEFORE);

            if (!(mode & Preformatted))
                TrimSpaces(doc, element);

#if !defined(NDEBUG) && defined(_MSC_VER)
            in_parse_block--;
            SPRTF("Exit ParseBlock 9b %d...\n",in_parse_block);
#endif
            return;
        }

        /* parse known element */
        if (TY_(nodeIsElement)(node))
        {
            if (node->tag->model & CM_INLINE)
            {
                if (checkstack && !node->implicit)
                {
                    checkstack = no;

                    if (!(element->tag->model & CM_MIXED)) /* #431731 - fix by Randy Waki 25 Dec 00 */
                    {
                        if ( TY_(InlineDup)(doc, node) > 0 )
                            continue;
                    }
                }

                mode = MixedContent;
            }
            else
            {
                checkstack = yes;
                mode = IgnoreWhitespace;
            }

            /* trim white space before <br> */
            if ( nodeIsBR(node) )
                TrimSpaces( doc, element );

            TY_(InsertNodeAtEnd)(element, node);
            
            if (node->implicit)
                TY_(ReportError)(doc, element, node, INSERTING_TAG );

            /* Issue #212 - WHY is this hard coded to 'IgnoreWhitespace' while an 
               effort has been made above to set a 'MixedContent' mode in some cases?
               WHY IS THE 'mode' VARIABLE NOT USED HERE???? */
            ParseTag( doc, node, IgnoreWhitespace /*MixedContent*/ );
            continue;
        }

        /* discard unexpected tags */
        if (node->type == EndTag)
            TY_(PopInline)( doc, node );  /* if inline end tag */

        TY_(ReportError)(doc, element, node, DISCARDING_UNEXPECTED );
        TY_(FreeNode)( doc, node );
        continue;
    }

    if (!(element->tag->model & CM_OPT))
        TY_(ReportError)(doc, element, node, MISSING_ENDTAG_FOR);

    if (element->tag->model & CM_OBJECT)
    {
        /* pop inline stack */
        while ( lexer->istacksize > lexer->istackbase )
            TY_(PopInline)( doc, NULL );
        lexer->istackbase = istackbase;
    }

    TrimSpaces( doc, element );
#if !defined(NDEBUG) && defined(_MSC_VER)
    in_parse_block--;
    SPRTF("Exit ParseBlock 10 %d...\n",in_parse_block);
#endif
}